

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

float wabt::interp::FloatDiv<float>(float lhs,float rhs)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  
  if ((rhs != 0.0) || (NAN(rhs))) {
    if (!NAN(lhs / rhs)) {
      return lhs / rhs;
    }
  }
  else if (lhs != 0.0) {
    auVar1._4_4_ = in_XMM1_Db ^ in_XMM0_Db;
    auVar1._0_4_ = (uint)rhs ^ (uint)lhs;
    auVar1._8_4_ = in_XMM1_Dc ^ in_XMM0_Dc;
    auVar1._12_4_ = in_XMM1_Dd ^ in_XMM0_Dd;
    uVar2 = movmskps(in_EAX,auVar1);
    return *(float *)(&DAT_001fa3d0 + (ulong)(uVar2 & 1) * 4);
  }
  return NAN;
}

Assistant:

T WABT_VECTORCALL FloatDiv(T lhs, T rhs) {
  // IEE754 specifies what should happen when dividing a float by zero, but
  // C/C++ says it is undefined behavior.
  if (WABT_UNLIKELY(rhs == 0)) {
    return std::isnan(lhs) || lhs == 0
               ? std::numeric_limits<T>::quiet_NaN()
               : ((std::signbit(lhs) ^ std::signbit(rhs))
                      ? -std::numeric_limits<T>::infinity()
                      : std::numeric_limits<T>::infinity());
  }
  return CanonNaN(lhs / rhs);
}